

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O2

void Kit_SopMakeCubeFree(Kit_Sop_t *cSop)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  uVar2 = Kit_SopCommonCube(cSop);
  if (uVar2 != 0) {
    for (lVar3 = 0; lVar3 < cSop->nCubes; lVar3 = lVar3 + 1) {
      uVar1 = cSop->pCubes[lVar3];
      if (uVar1 == 0) {
        return;
      }
      cSop->pCubes[lVar3] = uVar1 & ~uVar2;
    }
  }
  return;
}

Assistant:

void Kit_SopMakeCubeFree( Kit_Sop_t * cSop )
{
    unsigned uMask, uCube;
    int i;
    uMask = Kit_SopCommonCube( cSop );
    if ( uMask == 0 )
        return;
    // remove the common cube
    Kit_SopForEachCube( cSop, uCube, i )
        Kit_SopWriteCube( cSop, Kit_CubeSharp(uCube, uMask), i );
}